

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.hpp
# Opt level: O1

void __thiscall glu::StructMember::~StructMember(StructMember *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  glu::VarType::~VarType(&this->m_type);
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar2 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

StructMember	(const char* name, const VarType& type) : m_name(name), m_type(type) {}